

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
          (ProgramResourceQueryTestTarget *this,ProgramInterface interface_,deUint32 propFlags_)

{
  deUint32 propFlags__local;
  ProgramInterface interface__local;
  ProgramResourceQueryTestTarget *this_local;
  
  this->interface = interface_;
  this->propFlags = propFlags_;
  switch(this->interface) {
  case PROGRAMINTERFACE_UNIFORM:
    break;
  case PROGRAMINTERFACE_UNIFORM_BLOCK:
    break;
  default:
    break;
  case PROGRAMINTERFACE_PROGRAM_INPUT:
    break;
  case PROGRAMINTERFACE_PROGRAM_OUTPUT:
    break;
  case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
    break;
  case PROGRAMINTERFACE_BUFFER_VARIABLE:
    break;
  case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
  }
  return;
}

Assistant:

ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget (ProgramInterface interface_, deUint32 propFlags_)
	: interface(interface_)
	, propFlags(propFlags_)
{
	switch (interface)
	{
		case PROGRAMINTERFACE_UNIFORM:						DE_ASSERT((propFlags & PROGRAMRESOURCEPROP_UNIFORM_INTERFACE_MASK)			== propFlags);	break;
		case PROGRAMINTERFACE_UNIFORM_BLOCK:				DE_ASSERT((propFlags & PROGRAMRESOURCEPROP_UNIFORM_BLOCK_INTERFACE_MASK)	== propFlags);	break;
		case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:			DE_ASSERT((propFlags & PROGRAMRESOURCEPROP_SHADER_STORAGE_BLOCK_MASK)		== propFlags);	break;
		case PROGRAMINTERFACE_PROGRAM_INPUT:				DE_ASSERT((propFlags & PROGRAMRESOURCEPROP_PROGRAM_INPUT_MASK)				== propFlags);	break;
		case PROGRAMINTERFACE_PROGRAM_OUTPUT:				DE_ASSERT((propFlags & PROGRAMRESOURCEPROP_PROGRAM_OUTPUT_MASK)				== propFlags);	break;
		case PROGRAMINTERFACE_BUFFER_VARIABLE:				DE_ASSERT((propFlags & PROGRAMRESOURCEPROP_BUFFER_VARIABLE_MASK)			== propFlags);	break;
		case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:	DE_ASSERT((propFlags & PROGRAMRESOURCEPROP_TRANSFORM_FEEDBACK_VARYING_MASK)	== propFlags);	break;

		default:
			DE_ASSERT(false);
	}
}